

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

InsertResult __thiscall
wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>::insert
          (OrderedFixedStorage<wasm::LocalSet_*,_2UL> *this,LocalSet **x)

{
  ulong uVar1;
  LocalSet *pLVar2;
  ulong uVar3;
  ulong uVar4;
  LocalSet *pLVar5;
  
  uVar1 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used;
  pLVar5 = *x;
  uVar3 = 0;
  do {
    uVar4 = uVar1;
    if (uVar1 == uVar3) {
LAB_00ae9d2f:
      if (2 < uVar1) {
        __assert_fail("this->used <= N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_set.h"
                      ,99,
                      "InsertResult wasm::OrderedFixedStorage<wasm::LocalSet *, 2>::insert(const T &) [T = wasm::LocalSet *, N = 2]"
                     );
      }
      if (uVar1 != 2) {
        if (uVar4 != uVar1) {
          for (uVar3 = uVar1; uVar4 + 1 <= uVar3; uVar3 = uVar3 - 1) {
            (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar3] =
                 (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar3 - 1];
          }
          pLVar5 = *x;
        }
        (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar4] = pLVar5;
        (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used = uVar1 + 1;
        return NoError;
      }
      return CouldNotInsert;
    }
    pLVar2 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar3];
    if (pLVar5 <= pLVar2) {
      uVar4 = uVar3;
      if (pLVar2 == pLVar5) {
        return NoError;
      }
      goto LAB_00ae9d2f;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

InsertResult insert(const T& x) {
    // Find the insertion point |i| where x should be placed.
    size_t i = 0;
    while (i < this->used && this->storage[i] < x) {
      i++;
    }
    if (i < this->used && this->storage[i] == x) {
      // The item already exists.
      return InsertResult::NoError;
    }
    // |i| is now the location where x should be placed.

    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }

    if (i != this->used) {
      // Push things forward to make room for x.
      for (size_t j = this->used; j >= i + 1; j--) {
        this->storage[j] = this->storage[j - 1];
      }
    }

    this->storage[i] = x;
    this->used++;
    return InsertResult::NoError;
  }